

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_int_&>
* __thiscall
Catch::ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&>::operator<=
          (BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_int_&>
           *__return_storage_ptr__,
          ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&> *this,
          int *rhs)

{
  int *piVar1;
  bool bVar2;
  basic_optional<type_safe::direct_optional_storage<int>_> *this_00;
  StringRef local_38;
  
  this_00 = *(basic_optional<type_safe::direct_optional_storage<int>_> **)this;
  bVar2 = true;
  if ((this_00->super_optional_storage<type_safe::direct_optional_storage<int>_>).storage.empty_ ==
      false) {
    piVar1 = type_safe::basic_optional<type_safe::direct_optional_storage<int>_>::value(this_00);
    bVar2 = *piVar1 <= *rhs;
    this_00 = *(basic_optional<type_safe::direct_optional_storage<int>_> **)this;
  }
  StringRef::StringRef(&local_38,"<=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0022fe70;
  __return_storage_ptr__->m_lhs = this_00;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }